

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ekf.hpp
# Opt level: O1

void __thiscall EKF::observe(EKF *this,Vector3f *obs_p,Quaternionf *obs_q)

{
  SrcXprType *pSVar1;
  PlainObjectBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *this_00;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined8 *puVar6;
  Index dstRows_1;
  char *pcVar7;
  ActualDstType actualDst;
  Quaternionf dq;
  MatrixXf QR;
  VectorXf dx;
  MatrixXf Kt;
  MatrixXf Q;
  MatrixXf R;
  MatrixXf Sui;
  VectorXf error;
  MatrixXf Su;
  ActualDstType actualDst_3;
  MatrixXf H;
  undefined1 local_178 [8];
  undefined8 uStack_170;
  variable_if_dynamic<long,__1> local_168;
  SrcXprType local_160;
  variable_if_dynamic<long,__1> vStack_150;
  SrcXprType *local_148;
  char local_140;
  assign_op<float,_float> local_129;
  DenseStorage<float,__1,__1,__1,_0> local_128;
  SrcXprType local_110;
  undefined1 local_100 [16];
  DenseStorage<float,__1,__1,__1,_0> *local_f0;
  undefined1 local_e8 [16];
  SrcXprType *local_d8;
  undefined1 local_d0 [16];
  SrcXprType *local_c0;
  DenseStorage<float,__1,__1,__1,_0> *local_b8;
  Index local_b0;
  DenseStorage<float,__1,__1,__1,_0> local_a8;
  undefined1 local_88 [16];
  SrcXprType local_78;
  long local_68;
  MatrixXf *local_60;
  TriangularView<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_2U> local_58;
  uint local_50;
  DenseStorage<float,__1,__1,__1,_0> local_48;
  
  toVec((EKF *)local_d0,&this->gravity,(Quaternionf *)obs_p);
  toVec((EKF *)local_e8,&this->gravity,(Quaternionf *)&this->pos);
  local_178 = (undefined1  [8])local_d0;
  uStack_170 = (long)local_e8;
  if (local_d0._8_8_ != local_e8._8_8_) {
    __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                  "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,
                  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float>, const Eigen::Matrix<float, -1, 1>, const Eigen::Matrix<float, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<float>, Lhs = const Eigen::Matrix<float, -1, 1>, Rhs = const Eigen::Matrix<float, -1, 1>]"
                 );
  }
  Eigen::PlainObjectBase<Eigen::Matrix<float,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Matrix<float,_1,1,0,_1,1>const,Eigen::Matrix<float,_1,1,0,_1,1>const>>
            ((PlainObjectBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)local_88,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
              *)local_178);
  free((void *)local_e8._0_8_);
  free((void *)local_d0._0_8_);
  calcH((MatrixXf *)&local_48,this,&this->qua);
  local_128.m_data = (float *)0x0;
  local_128.m_rows = 0;
  local_128.m_cols = 0;
  Eigen::DenseStorage<float,_-1,_-1,_-1,_0>::resize(&local_128,0x100,0x10,0x10);
  local_178 = (undefined1  [8])local_128.m_rows;
  uStack_170 = local_128.m_cols;
  local_168.m_value = (ulong)local_168.m_value._4_4_ << 0x20;
  if ((local_128.m_cols | local_128.m_rows) < 0) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, Eigen::Matrix<float, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<float>, MatrixType = Eigen::Matrix<float, -1, -1>]"
                 );
  }
  Eigen::internal::call_dense_assignment_loop<Eigen::Matrix<float,_1,_1,0,_1,_1>>
            ((Matrix<float,__1,__1,_0,__1,__1> *)&local_128,
             (CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>
              *)local_178,(assign_op<float,_float> *)local_d0);
  local_178 = (undefined1  [8])local_128.m_data;
  uStack_170 = 7;
  local_168.m_value = 7;
  local_160.m_rhs =
       (CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>
        *)0x0;
  vStack_150.m_value = 0;
  local_148 = (SrcXprType *)local_128.m_rows;
  local_160.m_dec = (TriangularView<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_2U> *)&local_128;
  if ((6 < local_128.m_rows) && (6 < local_128.m_cols)) {
    local_100._0_8_ =
         (this->Wu).super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_data
    ;
    local_100._8_8_ =
         (this->Wu).super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_rows
    ;
    if (((DenseStorage<float,__1,__1,__1,_0> *)local_100._8_8_ !=
         (DenseStorage<float,__1,__1,__1,_0> *)0x7) ||
       ((this->Wu).super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_cols
        != 7)) goto LAB_0010f9ef;
    local_e8._0_8_ = local_128.m_data;
    local_d8 = (SrcXprType *)local_128.m_rows;
    local_d0._8_8_ = local_100;
    pSVar1 = (SrcXprType *)(local_88 + 0x10);
    local_d0._0_8_ = (EKF *)local_e8;
    local_c0 = pSVar1;
    local_b8 = (DenseStorage<float,__1,__1,__1,_0> *)local_178;
    Eigen::internal::
    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
    ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::internal::assign_op<float,_float>,_0>
           *)local_d0);
    if ((this->Pu).super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_cols
        != local_48.m_cols) {
      pcVar7 = 
      "Eigen::Product<Eigen::Matrix<float, -1, -1>, Eigen::Transpose<Eigen::Matrix<float, -1, -1>>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<float, -1, -1>, Rhs = Eigen::Transpose<Eigen::Matrix<float, -1, -1>>, Option = 0]"
      ;
      goto LAB_0010fb1b;
    }
    local_a8.m_data = (float *)&this->Pu;
    local_160.m_rhs =
         (CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>
          *)((long)&((SrcXprType *)(local_128.m_rows + -0x10))->m_dec + 7);
    local_178 = (undefined1  [8])((long)((Vector3f *)local_128.m_data + -3) + local_128.m_rows * 4);
    uStack_170 = 9;
    local_168.m_value = 7;
    vStack_150.m_value = 0;
    local_148 = (SrcXprType *)local_128.m_rows;
    local_160.m_dec = (TriangularView<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_2U> *)&local_128;
    local_a8.m_rows = (Index)&local_48;
    local_60 = (MatrixXf *)local_a8.m_data;
    if ((8 < local_128.m_rows) && (6 < local_128.m_cols)) {
      Eigen::Matrix<float,-1,-1,0,-1,-1>::
      Matrix<Eigen::Product<Eigen::Matrix<float,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>>,0>>
                ((Matrix<float,_1,_1,0,_1,_1> *)local_100,
                 (Product<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_0>
                  *)&local_a8);
      local_78.m_dec =
           (TriangularView<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_2U> *)local_100._0_8_;
      local_78.m_rhs =
           (CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>
            *)local_100._8_8_;
      if ((uStack_170 != local_100._8_8_) ||
         ((DenseStorage<float,__1,__1,__1,_0> *)local_168.m_value != local_f0)) {
LAB_0010f9ef:
        __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                      ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                      "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<float, -1, -1>>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<float, -1, -1>>]"
                     );
      }
      local_e8._0_8_ = local_178;
      local_d8 = *(SrcXprType **)((long)local_160.m_dec + 8);
      local_c0 = &local_110;
      local_d0._0_8_ = (EKF *)local_e8;
      local_d0._8_8_ = pSVar1;
      local_b8 = (DenseStorage<float,__1,__1,__1,_0> *)local_178;
      Eigen::internal::
      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
      ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::internal::assign_op<float,_float>,_0>
             *)local_d0);
      free((void *)local_100._0_8_);
      local_160.m_rhs =
           (CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>
            *)((long)&((SrcXprType *)(local_128.m_rows + -0x10))->m_dec + 7);
      vStack_150.m_value = local_128.m_cols - 9;
      local_178 = (undefined1  [8])
                  ((long)((Vector3f *)local_128.m_data + -3) +
                  vStack_150.m_value * local_128.m_rows * 4 + local_128.m_rows * 4);
      uStack_170 = 9;
      local_168.m_value = 9;
      local_148 = (SrcXprType *)local_128.m_rows;
      local_160.m_dec = (TriangularView<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_2U> *)&local_128;
      if ((8 < local_128.m_rows) && (8 < local_128.m_cols)) {
        local_100._0_8_ =
             (this->Pu).super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
             m_data;
        local_100._8_8_ =
             (this->Pu).super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
             m_rows;
        if (((DenseStorage<float,__1,__1,__1,_0> *)local_100._8_8_ !=
             (DenseStorage<float,__1,__1,__1,_0> *)0x9) ||
           ((this->Pu).super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
            m_cols != 9)) goto LAB_0010f9ef;
        local_d8 = (SrcXprType *)local_128.m_rows;
        local_e8._0_8_ = local_178;
        local_d0._0_8_ = (EKF *)local_e8;
        local_d0._8_8_ = (Matrix<float,_1,_1,0,_1,_1> *)local_100;
        local_c0 = pSVar1;
        local_b8 = (DenseStorage<float,__1,__1,__1,_0> *)local_178;
        Eigen::internal::
        dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
        ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::internal::assign_op<float,_float>,_0>
               *)local_d0);
        Eigen::HouseholderQR<Eigen::Matrix<float,-1,-1,0,-1,-1>>::
        HouseholderQR<Eigen::Matrix<float,_1,_1,0,_1,_1>>
                  ((HouseholderQR<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)local_178,
                   (EigenBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)&local_128);
        if (local_140 == '\0') {
          __assert_fail("m_isInitialized && \"HouseholderQR is not initialized.\"",
                        "/usr/include/eigen3/Eigen/src/QR/HouseholderQR.h",0xa5,
                        "HouseholderSequenceType Eigen::HouseholderQR<Eigen::Matrix<float, -1, -1>>::householderQ() const [MatrixType = Eigen::Matrix<float, -1, -1>]"
                       );
        }
        local_d0._8_8_ = &local_160;
        local_c0 = (SrcXprType *)((ulong)local_c0 & 0xffffffffffffff00);
        local_b8 = (DenseStorage<float,__1,__1,__1,_0> *)uStack_170;
        if (local_168.m_value < uStack_170) {
          local_b8 = (DenseStorage<float,__1,__1,__1,_0> *)local_168.m_value;
        }
        local_b0 = 0;
        local_d0._0_8_ = (EKF *)local_178;
        Eigen::PlainObjectBase<Eigen::Matrix<float,-1,-1,0,-1,-1>>::
        PlainObjectBase<Eigen::HouseholderSequence<Eigen::Matrix<float,_1,_1,0,_1,_1>,Eigen::Matrix<float,_1,1,0,_1,1>,1>>
                  ((PlainObjectBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)local_e8,
                   (EigenBase<Eigen::HouseholderSequence<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1>_>
                    *)local_d0);
        free((void *)vStack_150.m_value);
        free(local_160.m_dec);
        free((void *)local_178);
        if (local_e8._8_8_ != local_128.m_rows) {
LAB_0010fa0e:
          pcVar7 = 
          "Eigen::Product<Eigen::Transpose<Eigen::Matrix<float, -1, -1>>, Eigen::Matrix<float, -1, -1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Transpose<Eigen::Matrix<float, -1, -1>>, Rhs = Eigen::Matrix<float, -1, -1>, Option = 0]"
          ;
LAB_0010fb1b:
          __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                        ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,pcVar7);
        }
        local_178 = (undefined1  [8])local_e8;
        uStack_170 = (long)&local_128;
        Eigen::PlainObjectBase<Eigen::Matrix<float,-1,-1,0,-1,-1>>::
        PlainObjectBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>>,Eigen::Matrix<float,_1,_1,0,_1,_1>,0>>
                  ((PlainObjectBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)local_d0,
                   (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0>_>
                    *)local_178);
        vStack_150.m_value = (long)&local_c0[-1].m_dec + 7;
        local_178 = (undefined1  [8])
                    ((((Vector3f *)local_d0._0_8_)->
                     super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>).m_storage.m_data.
                     array + local_d0._8_8_ * vStack_150.m_value);
        uStack_170 = 7;
        local_168.m_value = 9;
        local_160.m_rhs =
             (CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>
              *)0x0;
        local_148 = (SrcXprType *)local_d0._8_8_;
        local_160.m_dec = (TriangularView<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_2U> *)local_d0;
        if ((8 < (long)local_c0) && (6 < (long)local_d0._8_8_)) {
          Eigen::PlainObjectBase<Eigen::Matrix<float,-1,-1,0,-1,-1>>::
          PlainObjectBase<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,_1,false>>
                    ((PlainObjectBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)local_100,
                     (DenseBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>_>
                      *)local_178);
          local_178 = (undefined1  [8])local_d0._0_8_;
          uStack_170 = 7;
          local_168.m_value = 7;
          local_160.m_rhs =
               (CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>
                *)0x0;
          vStack_150.m_value = 0;
          local_148 = (SrcXprType *)local_d0._8_8_;
          local_160.m_dec = (TriangularView<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_2U> *)local_d0;
          if ((6 < (long)local_d0._8_8_) && (6 < (long)local_c0)) {
            this_00 = (PlainObjectBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)(local_88 + 0x10);
            Eigen::PlainObjectBase<Eigen::Matrix<float,-1,-1,0,-1,-1>>::
            PlainObjectBase<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,_1,false>>
                      (this_00,(DenseBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>_>
                                *)local_178);
            local_110.m_dec = &local_58;
            local_178 = (undefined1  [8])0x7;
            uStack_170 = 7;
            local_a8.m_data = (float *)0x0;
            local_a8.m_rows = 0;
            local_a8.m_cols = 0;
            local_58.m_matrix = (MatrixTypeNested)this_00;
            if (0x1249249249249249 < local_68) {
              local_110.m_rhs =
                   (CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>
                    *)local_178;
              puVar6 = (undefined8 *)__cxa_allocate_exception(8);
              *puVar6 = operator_new;
              __cxa_throw(puVar6,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
            }
            if (local_68 < 0) {
              local_110.m_rhs =
                   (CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>
                    *)local_178;
              __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                            ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                            "void Eigen::PlainObjectBase<Eigen::Matrix<float, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<float, -1, -1>]"
                           );
            }
            local_110.m_rhs =
                 (CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>
                  *)local_178;
            Eigen::DenseStorage<float,_-1,_-1,_-1,_0>::resize(&local_a8,local_68 * 7,local_68,7);
            Eigen::internal::
            Assignment<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_Eigen::Solve<Eigen::TriangularView<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_2U>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>_>,_Eigen::internal::assign_op<float,_float>,_Eigen::internal::Dense2Dense,_void>
            ::run((Matrix<float,__1,__1,_0,__1,__1> *)&local_a8,&local_110,&local_129);
            local_160.m_rhs =
                 (CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>
                  *)((long)&((SrcXprType *)(local_d0._8_8_ + -0x10))->m_dec + 7);
            vStack_150.m_value = (long)&local_c0[-1].m_dec + 7;
            local_178 = (undefined1  [8])
                        ((long)((Vector3f *)local_d0._0_8_ + -3) +
                        vStack_150.m_value * local_d0._8_8_ * 4 + local_d0._8_8_ * 4);
            uStack_170 = 9;
            local_168.m_value = 9;
            local_148 = (SrcXprType *)local_d0._8_8_;
            local_160.m_dec =
                 (TriangularView<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_2U> *)local_d0;
            if ((8 < (long)local_d0._8_8_) && (8 < (long)local_c0)) {
              Eigen::internal::
              call_dense_assignment_loop<Eigen::Matrix<float,_1,_1,0,_1,_1>,Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::internal::assign_op<float,float>>
                        (local_60,(Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false> *)
                                  local_178,(assign_op<float,_float> *)&local_110);
              if (local_100._8_8_ == local_a8.m_rows) {
                local_168.m_value = (long)local_88;
                local_178 = (undefined1  [8])local_100;
                uStack_170 = (long)&local_a8;
                if (local_a8.m_cols != local_88._8_8_) {
                  pcVar7 = 
                  "Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float, -1, -1>>, Eigen::Matrix<float, -1, -1>>, Eigen::Matrix<float, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Product<Eigen::Transpose<Eigen::Matrix<float, -1, -1>>, Eigen::Matrix<float, -1, -1>>, Rhs = Eigen::Matrix<float, -1, 1>, Option = 0]"
                  ;
                  goto LAB_0010fb1b;
                }
                Eigen::PlainObjectBase<Eigen::Matrix<float,-1,1,0,-1,1>>::
                PlainObjectBase<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>>,Eigen::Matrix<float,_1,_1,0,_1,_1>,0>,Eigen::Matrix<float,_1,1,0,_1,1>,0>>
                          ((PlainObjectBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)&local_110,
                           (DenseBase<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0>_>
                            *)local_178);
                if (2 < (long)local_110.m_rhs) {
                  local_58.m_matrix._4_4_ =
                       *(undefined4 *)
                        ((long)&local_110.m_dec[-1].m_matrix + (long)local_110.m_rhs * 4);
                  local_58.m_matrix._0_4_ =
                       *(undefined4 *)((long)local_110.m_dec + (long)local_110.m_rhs * 4 + -0xc);
                  local_50 = *(uint *)((long)local_110.m_dec + (long)local_110.m_rhs * 4 + -4);
                  exp((EKF *)local_178,(double)(ulong)local_50);
                  if (2 < (long)local_110.m_rhs) {
                    fVar2 = (this->pos).super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                            m_storage.m_data.array[1];
                    (this->pos).super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                    m_storage.m_data.array[0] =
                         (this->pos).super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                         m_storage.m_data.array[0] + *(float *)&(local_110.m_dec)->m_matrix;
                    (this->pos).super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                    m_storage.m_data.array[1] =
                         fVar2 + *(float *)((long)&(local_110.m_dec)->m_matrix + 4);
                    (this->pos).super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                    m_storage.m_data.array[2] =
                         (this->pos).super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                         m_storage.m_data.array[2] + *(float *)&local_110.m_dec[1].m_matrix;
                    if (5 < (long)local_110.m_rhs) {
                      fVar2 = (this->vel).
                              super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                              m_data.array[1];
                      (this->vel).super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                      m_storage.m_data.array[0] =
                           (this->vel).super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                           m_storage.m_data.array[0] +
                           *(float *)((long)&local_110.m_dec[1].m_matrix + 4);
                      (this->vel).super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                      m_storage.m_data.array[1] = fVar2 + *(float *)&local_110.m_dec[2].m_matrix;
                      (this->vel).super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                      m_storage.m_data.array[2] =
                           (this->vel).super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                           m_storage.m_data.array[2] +
                           *(float *)((long)&local_110.m_dec[2].m_matrix + 4);
                      fVar2 = (this->qua).m_coeffs.
                              super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                              m_data.array[0];
                      fVar3 = (this->qua).m_coeffs.
                              super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                              m_data.array[1];
                      fVar4 = (this->qua).m_coeffs.
                              super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                              m_data.array[2];
                      fVar5 = (this->qua).m_coeffs.
                              super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                              m_data.array[3];
                      (this->qua).m_coeffs.
                      super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                      array[0] = (float)local_178._0_4_ * fVar5 + (float)uStack_170 * fVar3 +
                                 (uStack_170._4_4_ * fVar2 - (float)local_178._4_4_ * fVar4);
                      (this->qua).m_coeffs.
                      super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                      array[1] = (float)local_178._4_4_ * fVar5 + (float)local_178._0_4_ * fVar4 +
                                 (uStack_170._4_4_ * fVar3 - (float)uStack_170 * fVar2);
                      (this->qua).m_coeffs.
                      super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                      array[2] = (float)uStack_170 * fVar5 + (float)local_178._4_4_ * fVar2 +
                                 (uStack_170._4_4_ * fVar4 - (float)local_178._0_4_ * fVar3);
                      (this->qua).m_coeffs.
                      super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                      array[3] = -((float)local_178._4_4_ * fVar3 + (float)uStack_170 * fVar4) +
                                 (uStack_170._4_4_ * fVar5 - (float)local_178._0_4_ * fVar2);
                      free(local_110.m_dec);
                      free(local_a8.m_data);
                      free(local_78.m_dec);
                      free((void *)local_100._0_8_);
                      free((void *)local_d0._0_8_);
                      free((void *)local_e8._0_8_);
                      free(local_128.m_data);
                      free(local_48.m_data);
                      free((void *)local_88._0_8_);
                      return;
                    }
                    pcVar7 = 
                    "Eigen::Block<Eigen::Matrix<float, -1, 1>>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<float, -1, 1>, BlockRows = -1, BlockCols = -1, InnerPanel = false]"
                    ;
                    goto LAB_0010fb3a;
                  }
                }
                pcVar7 = 
                "Eigen::Block<Eigen::Matrix<float, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<float, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                ;
                goto LAB_0010fb3a;
              }
              goto LAB_0010fa0e;
            }
          }
        }
      }
    }
  }
  pcVar7 = 
  "Eigen::Block<Eigen::Matrix<float, -1, -1>>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<float, -1, -1>, BlockRows = -1, BlockCols = -1, InnerPanel = false]"
  ;
LAB_0010fb3a:
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,pcVar7);
}

Assistant:

void observe(const Eigen::Vector3f& obs_p, const Eigen::Quaternionf& obs_q)
  {
    // inovation residual vector (7x1)
    Eigen::VectorXf error = toVec(obs_p, obs_q) - toVec(pos, qua);

    // observation jacobian (7x9)
    Eigen::MatrixXf H = calcH(qua);

    // QR decompose
    Eigen::MatrixXf QR(16, 16);
    QR.setZero();
    QR.topLeftCorner(7, 7) = Wu;
    QR.bottomLeftCorner(9, 7) = Pu * H.transpose();  // (9x7)=(9x9)*(9x7)
    QR.bottomRightCorner(9, 9) = Pu;
    Eigen::MatrixXf Q = QR.householderQr().householderQ();  // (16x16)
    Eigen::MatrixXf R = Q.transpose() * QR;                 // (16x16)

    Eigen::MatrixXf Kt = R.topRightCorner(7, 9);             // (7x9) upper trianguler matrix of the modified Kalman gain
    Eigen::MatrixXf Su = R.topLeftCorner(7, 7);              // (7x7) upper trianguler matrix of the inovation matrix
    Eigen::MatrixXf Sui = Su.triangularView<Eigen::Upper>()  // (7x7) inverse of the upper trianguler of the inovation matrix
                              .solve(Eigen::MatrixXf::Identity(7, 7));

    // update variance covariance matrix
    Pu = R.bottomRightCorner(9, 9);

    Eigen::VectorXf dx = (Kt.transpose() * Sui) * error;  // (9x1)=(9x7)*(7x7)*(7x1)

    // updata state vector
    Eigen::Quaternionf dq = exp(dx.bottomRows(3));
    pos = pos + dx.topRows(3);
    vel = vel + dx.block(3, 0, 3, 1);
    qua = qua * dq;
  }